

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_table_done(PS_Table table)

{
  FT_Byte **ppFVar1;
  FT_Byte *__src;
  FT_Memory memory;
  FT_Byte *pFVar2;
  FT_Byte **ppFVar3;
  int local_2c;
  
  __src = table->block;
  if (__src != (FT_Byte *)0x0) {
    memory = table->memory;
    pFVar2 = (FT_Byte *)ft_mem_alloc(memory,table->cursor,&local_2c);
    table->block = pFVar2;
    if (local_2c == 0) {
      memcpy(pFVar2,__src,table->cursor);
      if (0 < (long)table->max_elems) {
        pFVar2 = table->block;
        ppFVar3 = table->elements;
        ppFVar1 = ppFVar3 + table->max_elems;
        do {
          if (*ppFVar3 != (FT_Byte *)0x0) {
            *ppFVar3 = *ppFVar3 + ((long)pFVar2 - (long)__src);
          }
          ppFVar3 = ppFVar3 + 1;
        } while (ppFVar3 < ppFVar1);
      }
      table->capacity = table->cursor;
      ft_mem_free(memory,__src);
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_table_done( PS_Table  table )
  {
    FT_Memory  memory = table->memory;
    FT_Error   error;
    FT_Byte*   old_base = table->block;


    /* should never fail, because rec.cursor <= rec.size */
    if ( !old_base )
      return;

    if ( FT_ALLOC( table->block, table->cursor ) )
      return;
    FT_MEM_COPY( table->block, old_base, table->cursor );
    shift_elements( table, old_base );

    table->capacity = table->cursor;
    FT_FREE( old_base );

    FT_UNUSED( error );
  }